

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenizer.cpp
# Opt level: O2

optional<Token> * __thiscall
Tokenizer::nextToken(optional<Token> *__return_storage_ptr__,Tokenizer *this)

{
  unsigned_long uVar1;
  ushort uVar2;
  _Storage<char,_true> ch;
  bool bVar3;
  optional<char> oVar4;
  int iVar5;
  uint32_t uVar6;
  uint uVar7;
  iterator iVar8;
  string *psVar9;
  optional<Token> *poVar10;
  uint uVar11;
  any *paVar12;
  int iVar13;
  allocator<char> local_571;
  optional<Token> *local_570;
  out_of_range anon_var_0;
  undefined4 uStack_564;
  any local_560;
  undefined8 local_550;
  undefined1 local_548 [32];
  any local_528;
  any local_518;
  any local_508;
  any local_4f8;
  any local_4e8;
  any local_4d8;
  any local_4c8;
  any local_4b8;
  any local_4a8;
  any local_498;
  any local_488;
  any local_478;
  any local_468;
  any local_458;
  any local_448;
  any local_438;
  any local_428;
  any local_418;
  any local_408;
  any local_3f8;
  any local_3e8;
  any local_3d8;
  any local_3c8;
  any local_3b8;
  any local_3a8;
  string local_398;
  string local_378;
  string local_358 [224];
  string local_278 [32];
  string local_258 [96];
  string local_1f8 [32];
  string local_1d8 [32];
  stringstream ss;
  ostream local_1a8 [376];
  
  local_570 = __return_storage_ptr__;
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  uVar7 = 0;
LAB_0010c15f:
  do {
    oVar4 = nextChar(this);
  } while (0x11 < uVar7);
  ch._M_value = oVar4.super__Optional_base<char,_true,_true>._M_payload.
                super__Optional_payload_base<char>._M_payload;
  uVar11 = (uint)(ushort)oVar4.super__Optional_base<char,_true,_true>._M_payload.
                         super__Optional_payload_base<char>;
  switch(uVar7) {
  case 0:
    if (((ushort)oVar4.super__Optional_base<char,_true,_true>._M_payload.
                 super__Optional_payload_base<char> >> 8 & 1) == 0) {
      (local_570->super__Optional_base<Token,_false,_false>)._M_payload.
      super__Optional_payload<Token,_true,_false,_false>.super__Optional_payload_base<Token>.
      _M_engaged = false;
      poVar10 = local_570;
      goto LAB_0010caca;
    }
    iVar13 = (int)ch._M_value;
    iVar5 = miniplc0::isspace(iVar13);
    uVar7 = 0;
    if ((char)iVar5 == '\0') {
      iVar5 = miniplc0::isprint(iVar13);
      if ((char)iVar5 == '\0') goto switchD_0010c1f5_caseD_22;
      uVar7 = 1;
      if (9 < (uVar11 & 0xfe) - 0x30) {
        iVar5 = miniplc0::isalpha(iVar13);
        uVar7 = 6;
        if ((char)iVar5 == '\0') {
          uVar2 = (ushort)oVar4.super__Optional_base<char,_true,_true>._M_payload.
                          super__Optional_payload_base<char> & 0xff;
          uVar7 = 7;
          switch(uVar2) {
          case 0x21:
            uVar7 = 0xf;
            break;
          case 0x22:
          case 0x23:
          case 0x24:
          case 0x25:
          case 0x26:
          case 0x27:
          case 0x2e:
          case 0x30:
          case 0x31:
          case 0x32:
          case 0x33:
          case 0x34:
          case 0x35:
          case 0x36:
          case 0x37:
          case 0x38:
          case 0x39:
          case 0x3a:
switchD_0010c1f5_caseD_22:
            unreadLast(this);
            psVar9 = (string *)__cxa_allocate_exception(0x28);
            std::__cxx11::string::string<std::allocator<char>>
                      (local_1d8,"InvalidInputErr",(allocator<char> *)&anon_var_0);
            uVar1 = (this->_ptr).first;
            std::__cxx11::string::string(psVar9,local_1d8);
            *(unsigned_long *)(psVar9 + 0x20) = uVar1 + 1;
            __cxa_throw(psVar9,&Error::typeinfo,Error::~Error);
          case 0x28:
            uVar7 = 9;
            break;
          case 0x29:
            uVar7 = 10;
            break;
          case 0x2a:
            uVar7 = 5;
            break;
          case 0x2b:
            uVar7 = 2;
            break;
          case 0x2c:
            uVar7 = 0x10;
            break;
          case 0x2d:
            uVar7 = 3;
            break;
          case 0x2f:
            uVar7 = 4;
            break;
          case 0x3b:
            uVar7 = 8;
            break;
          case 0x3c:
            uVar7 = 0xc;
            break;
          case 0x3d:
            break;
          case 0x3e:
            uVar7 = 0xb;
            break;
          default:
            if (uVar2 == 0x7b) {
              uVar7 = 0xd;
            }
            else {
              if (uVar2 != 0x7d) goto switchD_0010c1f5_caseD_22;
              uVar7 = 0xe;
            }
          }
        }
      }
      std::operator<<(local_1a8,ch._M_value);
    }
    goto LAB_0010c15f;
  case 1:
    if (((ushort)oVar4.super__Optional_base<char,_true,_true>._M_payload.
                 super__Optional_payload_base<char> >> 8 & 1) == 0) {
      std::__cxx11::stringbuf::str();
      if (*(char *)CONCAT44(uStack_564,_anon_var_0) == '0') {
        std::__cxx11::stringbuf::str();
        std::__cxx11::string::~string((string *)local_548);
        std::__cxx11::string::~string((string *)&anon_var_0);
        if ((_func_void__Op_any_ptr__Arg_ptr *)0x1 < (ulong)local_548._8_8_) {
          psVar9 = (string *)__cxa_allocate_exception(0x28);
          std::__cxx11::string::string<std::allocator<char>>
                    (local_1f8,"StartWithZeroErr",(allocator<char> *)&anon_var_0);
          uVar1 = (this->_ptr).first;
          std::__cxx11::string::string(psVar9,local_1f8);
          *(unsigned_long *)(psVar9 + 0x20) = uVar1 + 1;
          __cxa_throw(psVar9,&Error::typeinfo,Error::~Error);
        }
      }
      else {
        std::__cxx11::string::~string((string *)&anon_var_0);
      }
      std::__cxx11::stringbuf::str();
      uVar7 = std::__cxx11::stoi((string *)&anon_var_0,(size_t *)0x0,10);
      std::__cxx11::string::~string((string *)&anon_var_0);
      local_3a8._M_manager = std::any::_Manager_internal<int>::_S_manage;
      local_3a8._M_storage._4_4_ = 0;
      local_3a8._M_storage._0_4_ = uVar7;
      uVar1 = (this->_ptr).first;
      _anon_var_0 = UNSIGNED_INTEGER;
      std::any::any(&local_560,&local_3a8);
      poVar10 = local_570;
      local_550 = uVar1 + 1;
      std::optional<Token>::optional<Token,_true>(local_570,(Token *)&anon_var_0);
      std::any::reset(&local_560);
      paVar12 = &local_3a8;
      break;
    }
    if (9 < (uVar11 & 0xfe) - 0x30) {
      iVar5 = miniplc0::isalpha((int)ch._M_value);
      if ((char)iVar5 == '\0') {
        unreadLast(this);
        std::__cxx11::stringbuf::str();
        if (*(char *)CONCAT44(uStack_564,_anon_var_0) == '0') {
          std::__cxx11::stringbuf::str();
          std::__cxx11::string::~string((string *)local_548);
          std::__cxx11::string::~string((string *)&anon_var_0);
          if ((_func_void__Op_any_ptr__Arg_ptr *)0x1 < (ulong)local_548._8_8_) {
            psVar9 = (string *)__cxa_allocate_exception(0x28);
            std::__cxx11::string::string<std::allocator<char>>
                      (local_278,"StartWithZeroErr",(allocator<char> *)&anon_var_0);
            uVar1 = (this->_ptr).first;
            std::__cxx11::string::string(psVar9,local_278);
            *(unsigned_long *)(psVar9 + 0x20) = uVar1 + 1;
            __cxa_throw(psVar9,&Error::typeinfo,Error::~Error);
          }
        }
        else {
          std::__cxx11::string::~string((string *)&anon_var_0);
        }
        std::__cxx11::stringbuf::str();
        uVar7 = std::__cxx11::stoi((string *)&anon_var_0,(size_t *)0x0,10);
        std::__cxx11::string::~string((string *)&anon_var_0);
        local_3b8._M_manager = std::any::_Manager_internal<int>::_S_manage;
        local_3b8._M_storage._4_4_ = 0;
        local_3b8._M_storage._0_4_ = uVar7;
        uVar1 = (this->_ptr).first;
        _anon_var_0 = UNSIGNED_INTEGER;
        std::any::any(&local_560,&local_3b8);
        poVar10 = local_570;
        local_550 = uVar1 + 1;
        std::optional<Token>::optional<Token,_true>(local_570,(Token *)&anon_var_0);
        std::any::reset(&local_560);
        paVar12 = &local_3b8;
        break;
      }
      std::operator<<(local_1a8,ch._M_value);
      std::__cxx11::stringbuf::str();
      if (local_560._M_manager == (_func_void__Op_any_ptr__Arg_ptr *)0x2) goto code_r0x0010c2dc;
      std::__cxx11::string::~string((string *)&anon_var_0);
      goto LAB_0010d1a8;
    }
    std::operator<<(local_1a8,ch._M_value);
    uVar7 = 1;
    goto LAB_0010c15f;
  case 2:
    unreadLast(this);
    local_3e8._M_manager = std::any::_Manager_internal<char>::_S_manage;
    local_3e8._M_storage = (_Storage)0x2b;
    uVar1 = (this->_ptr).first;
    _anon_var_0 = PLUS_SIGN;
    std::any::any(&local_560,&local_3e8);
    poVar10 = local_570;
    local_550 = uVar1 + 1;
    std::optional<Token>::optional<Token,_true>(local_570,(Token *)&anon_var_0);
    std::any::reset(&local_560);
    paVar12 = &local_3e8;
    break;
  case 3:
    unreadLast(this);
    local_3f8._M_manager = std::any::_Manager_internal<char>::_S_manage;
    local_3f8._M_storage = (_Storage)0x2d;
    uVar1 = (this->_ptr).first;
    _anon_var_0 = MINUS_SIGN;
    std::any::any(&local_560,&local_3f8);
    poVar10 = local_570;
    local_550 = uVar1 + 1;
    std::optional<Token>::optional<Token,_true>(local_570,(Token *)&anon_var_0);
    std::any::reset(&local_560);
    paVar12 = &local_3f8;
    break;
  case 4:
    unreadLast(this);
    local_418._M_manager = std::any::_Manager_internal<char>::_S_manage;
    local_418._M_storage = (_Storage)0x2f;
    uVar1 = (this->_ptr).first;
    _anon_var_0 = DIVISION_SIGN;
    std::any::any(&local_560,&local_418);
    poVar10 = local_570;
    local_550 = uVar1 + 1;
    std::optional<Token>::optional<Token,_true>(local_570,(Token *)&anon_var_0);
    std::any::reset(&local_560);
    paVar12 = &local_418;
    break;
  case 5:
    unreadLast(this);
    local_408._M_manager = std::any::_Manager_internal<char>::_S_manage;
    local_408._M_storage = (_Storage)0x2a;
    uVar1 = (this->_ptr).first;
    _anon_var_0 = MULTIPLICATION_SIGN;
    std::any::any(&local_560,&local_408);
    poVar10 = local_570;
    local_550 = uVar1 + 1;
    std::optional<Token>::optional<Token,_true>(local_570,(Token *)&anon_var_0);
    std::any::reset(&local_560);
    paVar12 = &local_408;
    break;
  case 6:
    if (((ushort)oVar4.super__Optional_base<char,_true,_true>._M_payload.
                 super__Optional_payload_base<char> >> 8 & 1) == 0) {
      std::__cxx11::stringbuf::str();
      iVar8 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::find(&ReservedWords_abi_cxx11_._M_t,(key_type *)&anon_var_0);
      if ((_Rb_tree_header *)iVar8._M_node ==
          &ReservedWords_abi_cxx11_._M_t._M_impl.super__Rb_tree_header) {
        std::any::
        any<std::__cxx11::string&,std::__cxx11::string,std::any::_Manager_external<std::__cxx11::string>,void>
                  (&local_4c8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&anon_var_0)
        ;
        uVar1 = (this->_ptr).first;
        local_548._0_4_ = IDENTIFIER;
        std::any::any((any *)(local_548 + 8),&local_4c8);
        poVar10 = local_570;
        local_548._24_8_ = uVar1 + 1;
        std::optional<Token>::optional<Token,_true>(local_570,(Token *)local_548);
        std::any::reset((any *)(local_548 + 8));
        paVar12 = &local_4c8;
      }
      else {
        std::any::
        any<std::__cxx11::string&,std::__cxx11::string,std::any::_Manager_external<std::__cxx11::string>,void>
                  (&local_4b8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&anon_var_0)
        ;
        uVar1 = (this->_ptr).first;
        local_548._0_4_ = RESERVED_WORD;
        std::any::any((any *)(local_548 + 8),&local_4b8);
        poVar10 = local_570;
        local_548._24_8_ = uVar1 + 1;
        std::optional<Token>::optional<Token,_true>(local_570,(Token *)local_548);
        std::any::reset((any *)(local_548 + 8));
        paVar12 = &local_4b8;
      }
    }
    else {
      iVar5 = miniplc0::isalpha((int)ch._M_value);
      if (((char)iVar5 != '\0') || ((uVar11 & 0xfe) - 0x30 < 10)) {
        std::operator<<(local_1a8,ch._M_value);
        uVar7 = 6;
        goto LAB_0010c15f;
      }
      unreadLast(this);
      std::__cxx11::stringbuf::str();
      iVar8 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::find(&ReservedWords_abi_cxx11_._M_t,(key_type *)&anon_var_0);
      if ((_Rb_tree_header *)iVar8._M_node ==
          &ReservedWords_abi_cxx11_._M_t._M_impl.super__Rb_tree_header) {
        std::any::
        any<std::__cxx11::string&,std::__cxx11::string,std::any::_Manager_external<std::__cxx11::string>,void>
                  (&local_4e8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&anon_var_0)
        ;
        uVar1 = (this->_ptr).first;
        local_548._0_4_ = IDENTIFIER;
        std::any::any((any *)(local_548 + 8),&local_4e8);
        poVar10 = local_570;
        local_548._24_8_ = uVar1 + 1;
        std::optional<Token>::optional<Token,_true>(local_570,(Token *)local_548);
        std::any::reset((any *)(local_548 + 8));
        paVar12 = &local_4e8;
      }
      else {
        std::any::
        any<std::__cxx11::string&,std::__cxx11::string,std::any::_Manager_external<std::__cxx11::string>,void>
                  (&local_4d8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&anon_var_0)
        ;
        uVar1 = (this->_ptr).first;
        local_548._0_4_ = RESERVED_WORD;
        std::any::any((any *)(local_548 + 8),&local_4d8);
        poVar10 = local_570;
        local_548._24_8_ = uVar1 + 1;
        std::optional<Token>::optional<Token,_true>(local_570,(Token *)local_548);
        std::any::reset((any *)(local_548 + 8));
        paVar12 = &local_4d8;
      }
    }
    std::any::reset(paVar12);
    psVar9 = (string *)&anon_var_0;
    goto LAB_0010c985;
  case 7:
    if (((ushort)oVar4.super__Optional_base<char,_true,_true>._M_payload.
                 super__Optional_payload_base<char> >> 8 & 1) == 0) {
      std::__throw_bad_optional_access();
    }
    if (ch._M_value == 0x3d) {
      std::__cxx11::string::string<std::allocator<char>>((string *)local_548,"==",&local_571);
      std::any::
      any<std::__cxx11::string,std::__cxx11::string,std::any::_Manager_external<std::__cxx11::string>,void>
                (&local_4f8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_548);
      uVar1 = (this->_ptr).first;
      _anon_var_0 = EQUAL_SIGN;
      std::any::any(&local_560,&local_4f8);
      poVar10 = local_570;
      local_550 = uVar1 + 1;
      std::optional<Token>::optional<Token,_true>(local_570,(Token *)&anon_var_0);
      std::any::reset(&local_560);
      paVar12 = &local_4f8;
      goto LAB_0010c97b;
    }
    unreadLast(this);
    local_488._M_manager = std::any::_Manager_internal<char>::_S_manage;
    local_488._M_storage = (_Storage)0x3d;
    uVar1 = (this->_ptr).first;
    _anon_var_0 = ASSIGNMENT_SIGN;
    std::any::any(&local_560,&local_488);
    poVar10 = local_570;
    local_550 = uVar1 + 1;
    std::optional<Token>::optional<Token,_true>(local_570,(Token *)&anon_var_0);
    std::any::reset(&local_560);
    paVar12 = &local_488;
    break;
  case 8:
    unreadLast(this);
    local_428._M_manager = std::any::_Manager_internal<char>::_S_manage;
    local_428._M_storage = (_Storage)0x3b;
    uVar1 = (this->_ptr).first;
    _anon_var_0 = SEMICOLON;
    std::any::any(&local_560,&local_428);
    poVar10 = local_570;
    local_550 = uVar1 + 1;
    std::optional<Token>::optional<Token,_true>(local_570,(Token *)&anon_var_0);
    std::any::reset(&local_560);
    paVar12 = &local_428;
    break;
  case 9:
    unreadLast(this);
    local_438._M_manager = std::any::_Manager_internal<char>::_S_manage;
    local_438._M_storage = (_Storage)0x28;
    uVar1 = (this->_ptr).first;
    _anon_var_0 = LEFT_BRACKET;
    std::any::any(&local_560,&local_438);
    poVar10 = local_570;
    local_550 = uVar1 + 1;
    std::optional<Token>::optional<Token,_true>(local_570,(Token *)&anon_var_0);
    std::any::reset(&local_560);
    paVar12 = &local_438;
    break;
  case 10:
    unreadLast(this);
    local_448._M_manager = std::any::_Manager_internal<char>::_S_manage;
    local_448._M_storage = (_Storage)0x29;
    uVar1 = (this->_ptr).first;
    _anon_var_0 = RIGHT_BRACKET;
    std::any::any(&local_560,&local_448);
    poVar10 = local_570;
    local_550 = uVar1 + 1;
    std::optional<Token>::optional<Token,_true>(local_570,(Token *)&anon_var_0);
    std::any::reset(&local_560);
    paVar12 = &local_448;
    break;
  case 0xb:
    if (((ushort)oVar4.super__Optional_base<char,_true,_true>._M_payload.
                 super__Optional_payload_base<char> >> 8 & 1) == 0) {
      std::__throw_bad_optional_access();
    }
    if (ch._M_value == 0x3d) {
      std::__cxx11::string::string<std::allocator<char>>((string *)local_548,">=",&local_571);
      std::any::
      any<std::__cxx11::string,std::__cxx11::string,std::any::_Manager_external<std::__cxx11::string>,void>
                (&local_508,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_548);
      uVar1 = (this->_ptr).first;
      _anon_var_0 = GREATER_THAN_EQUAL_SIGH;
      std::any::any(&local_560,&local_508);
      poVar10 = local_570;
      local_550 = uVar1 + 1;
      std::optional<Token>::optional<Token,_true>(local_570,(Token *)&anon_var_0);
      std::any::reset(&local_560);
      paVar12 = &local_508;
      goto LAB_0010c97b;
    }
    unreadLast(this);
    local_498._M_manager = std::any::_Manager_internal<char>::_S_manage;
    local_498._M_storage = (_Storage)0x7b;
    uVar1 = (this->_ptr).first;
    _anon_var_0 = GREATER_THAN_SIGH;
    std::any::any(&local_560,&local_498);
    poVar10 = local_570;
    local_550 = uVar1 + 1;
    std::optional<Token>::optional<Token,_true>(local_570,(Token *)&anon_var_0);
    std::any::reset(&local_560);
    paVar12 = &local_498;
    break;
  case 0xc:
    if (((ushort)oVar4.super__Optional_base<char,_true,_true>._M_payload.
                 super__Optional_payload_base<char> >> 8 & 1) == 0) {
      std::__throw_bad_optional_access();
    }
    if (ch._M_value == 0x3d) {
      std::__cxx11::string::string<std::allocator<char>>((string *)local_548,"<=",&local_571);
      std::any::
      any<std::__cxx11::string,std::__cxx11::string,std::any::_Manager_external<std::__cxx11::string>,void>
                (&local_518,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_548);
      uVar1 = (this->_ptr).first;
      _anon_var_0 = LESS_THAN_EQUAL_SIGH;
      std::any::any(&local_560,&local_518);
      poVar10 = local_570;
      local_550 = uVar1 + 1;
      std::optional<Token>::optional<Token,_true>(local_570,(Token *)&anon_var_0);
      std::any::reset(&local_560);
      paVar12 = &local_518;
      goto LAB_0010c97b;
    }
    unreadLast(this);
    local_4a8._M_manager = std::any::_Manager_internal<char>::_S_manage;
    local_4a8._M_storage = (_Storage)0x3c;
    uVar1 = (this->_ptr).first;
    _anon_var_0 = LESS_THAN_SIGH;
    std::any::any(&local_560,&local_4a8);
    poVar10 = local_570;
    local_550 = uVar1 + 1;
    std::optional<Token>::optional<Token,_true>(local_570,(Token *)&anon_var_0);
    std::any::reset(&local_560);
    paVar12 = &local_4a8;
    break;
  case 0xd:
    unreadLast(this);
    local_468._M_manager = std::any::_Manager_internal<char>::_S_manage;
    local_468._M_storage = (_Storage)0x7b;
    uVar1 = (this->_ptr).first;
    _anon_var_0 = LEFT_BRACE;
    std::any::any(&local_560,&local_468);
    poVar10 = local_570;
    local_550 = uVar1 + 1;
    std::optional<Token>::optional<Token,_true>(local_570,(Token *)&anon_var_0);
    std::any::reset(&local_560);
    paVar12 = &local_468;
    break;
  case 0xe:
    unreadLast(this);
    local_478._M_manager = std::any::_Manager_internal<char>::_S_manage;
    local_478._M_storage = (_Storage)0x7d;
    uVar1 = (this->_ptr).first;
    _anon_var_0 = RIGHT_BRACE;
    std::any::any(&local_560,&local_478);
    poVar10 = local_570;
    local_550 = uVar1 + 1;
    std::optional<Token>::optional<Token,_true>(local_570,(Token *)&anon_var_0);
    std::any::reset(&local_560);
    paVar12 = &local_478;
    break;
  case 0xf:
    if (((ushort)oVar4.super__Optional_base<char,_true,_true>._M_payload.
                 super__Optional_payload_base<char> >> 8 & 1) == 0) {
      std::__throw_bad_optional_access();
    }
    if (ch._M_value != 0x3d) {
      psVar9 = (string *)__cxa_allocate_exception(0x28);
      std::__cxx11::string::string<std::allocator<char>>
                (local_358,"InvalidInputErr",(allocator<char> *)&anon_var_0);
      uVar1 = (this->_ptr).first;
      std::__cxx11::string::string(psVar9,local_358);
      *(unsigned_long *)(psVar9 + 0x20) = uVar1 + 1;
      __cxa_throw(psVar9,&Error::typeinfo,Error::~Error);
    }
    std::__cxx11::string::string<std::allocator<char>>((string *)local_548,"!=",&local_571);
    std::any::
    any<std::__cxx11::string,std::__cxx11::string,std::any::_Manager_external<std::__cxx11::string>,void>
              (&local_528,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_548);
    uVar1 = (this->_ptr).first;
    _anon_var_0 = UNEQUAL_SIGN;
    std::any::any(&local_560,&local_528);
    poVar10 = local_570;
    local_550 = uVar1 + 1;
    std::optional<Token>::optional<Token,_true>(local_570,(Token *)&anon_var_0);
    std::any::reset(&local_560);
    paVar12 = &local_528;
LAB_0010c97b:
    std::any::reset(paVar12);
    psVar9 = (string *)local_548;
LAB_0010c985:
    std::__cxx11::string::~string(psVar9);
    goto LAB_0010caca;
  case 0x10:
    unreadLast(this);
    local_458._M_manager = std::any::_Manager_internal<char>::_S_manage;
    local_458._M_storage = (_Storage)0x2c;
    uVar1 = (this->_ptr).first;
    _anon_var_0 = COMMA_SIGH;
    std::any::any(&local_560,&local_458);
    poVar10 = local_570;
    local_550 = uVar1 + 1;
    std::optional<Token>::optional<Token,_true>(local_570,(Token *)&anon_var_0);
    std::any::reset(&local_560);
    paVar12 = &local_458;
    break;
  case 0x11:
    if (((ushort)oVar4.super__Optional_base<char,_true,_true>._M_payload.
                 super__Optional_payload_base<char> >> 8 & 1) == 0) {
      std::__cxx11::stringbuf::str();
      uVar6 = htoi(&local_378);
      std::__cxx11::string::~string((string *)&local_378);
      local_3c8._M_manager = std::any::_Manager_internal<int>::_S_manage;
      local_3c8._M_storage._4_4_ = 0;
      local_3c8._M_storage._0_4_ = uVar6;
      uVar1 = (this->_ptr).first;
      _anon_var_0 = UNSIGNED_INTEGER;
      std::any::any(&local_560,&local_3c8);
      poVar10 = local_570;
      local_550 = uVar1 + 1;
      std::optional<Token>::optional<Token,_true>(local_570,(Token *)&anon_var_0);
      std::any::reset(&local_560);
      paVar12 = &local_3c8;
    }
    else {
      bVar3 = miniplc0::ishexadecimal(ch._M_value);
      if (bVar3) {
        std::operator<<(local_1a8,ch._M_value);
        uVar7 = 0x11;
        goto LAB_0010c15f;
      }
      unreadLast(this);
      std::__cxx11::stringbuf::str();
      uVar6 = htoi(&local_398);
      std::__cxx11::string::~string((string *)&local_398);
      local_3d8._M_manager = std::any::_Manager_internal<int>::_S_manage;
      local_3d8._M_storage._4_4_ = 0;
      local_3d8._M_storage._0_4_ = uVar6;
      uVar1 = (this->_ptr).first;
      _anon_var_0 = UNSIGNED_INTEGER;
      std::any::any(&local_560,&local_3d8);
      poVar10 = local_570;
      local_550 = uVar1 + 1;
      std::optional<Token>::optional<Token,_true>(local_570,(Token *)&anon_var_0);
      std::any::reset(&local_560);
      paVar12 = &local_3d8;
    }
  }
  std::any::reset(paVar12);
LAB_0010caca:
  std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  return poVar10;
code_r0x0010c2dc:
  std::__cxx11::string::~string((string *)&anon_var_0);
  uVar7 = 0x11;
  if ((ch._M_value & 0xdfU) != 0x58) {
LAB_0010d1a8:
    psVar9 = (string *)__cxa_allocate_exception(0x28);
    std::__cxx11::string::string<std::allocator<char>>
              (local_258,"InvalidInputErr",(allocator<char> *)&anon_var_0);
    uVar1 = (this->_ptr).first;
    std::__cxx11::string::string(psVar9,local_258);
    *(unsigned_long *)(psVar9 + 0x20) = uVar1 + 1;
    __cxa_throw(psVar9,&Error::typeinfo,Error::~Error);
  }
  goto LAB_0010c15f;
}

Assistant:

std::optional<Token> Tokenizer::nextToken() {
	std::stringstream ss;
	DFAState current_state = DFAState::INITIAL_STATE;
	while (true) {
		auto current_char = nextChar();
		switch (current_state)
		{
		case DFAState::INITIAL_STATE: {
			//�����ļ�β
			if (!current_char.has_value()) {
				return {};
			}

			auto ch = current_char.value();
			// �����Ƿ������˲��Ϸ����ַ�����ʼ��Ϊ��
			auto invalid = false;

			if (miniplc0::isspace(ch)) // �������ַ��ǿհ��ַ����ո񡢻��С��Ʊ����ȣ�
				current_state = DFAState::INITIAL_STATE;
			else if (!miniplc0::isprint(ch)) // control codes and backspace
				invalid = true;
			else if (miniplc0::isdigit(ch))
				current_state = DFAState::UNSIGNED_INTEGER_STATE;
			else if (miniplc0::isalpha(ch))
				current_state = DFAState::IDENTIFIER_STATE;
			else {
				switch (ch) {
				case '=':
					current_state = DFAState::EQUAL_SIGN_STATE;
					break;
				case '-':
					current_state = DFAState::MINUS_SIGN_STATE;
					break;
				case '+':
					current_state = DFAState::PLUS_SIGN_STATE;
					break;
				case '*':
					current_state = DFAState::MULTIPLICATION_SIGN_STATE;
					break;
				case '/':
					current_state = DFAState::DIVISION_SIGN_STATE;
					break;
				case ';':
					current_state = DFAState::SEMICOLON_STATE;
					break;
				case '(':
					current_state = DFAState::LEFTBRACKET_STATE;
					break;
				case ')':
					current_state = DFAState::RIGHTBRACKET_STATE;
					break;

					//��min0�Ļ�����������6��״̬
				case '>':
					current_state = DFAState::GREATER_THAN_STATE;
					break;
				case '<':
					current_state = DFAState::LESS_THAN_STATE;
					break;
				case '{':
					current_state = DFAState::LEFTBRACE_STATE;
					break;
				case '}':
					current_state = DFAState::RIGHTBRACE_STATE;
					break;
				case '!':
					current_state = DFAState::EXCLAMATION_SIGH_STATE;
					break;
				case ',':
					current_state = DFAState::COMMA_STATE;
					break;

					// �����ܵ��ַ����µĲ��Ϸ���״̬
				default:
					invalid = true;
					break;
				}
			}
			if (invalid) {
				unreadLast();
				throw Error("InvalidInputErr", _ptr.first + 1);
			}
			// �����������ַ�������״̬��ת�ƣ�˵������һ��token�ĵ�һ���ַ�
			if (current_state != DFAState::INITIAL_STATE) // ignore white spaces
				ss << ch; // �洢�������ַ�
			break;
		}
		case DFAState::UNSIGNED_INTEGER_STATE: {
			// ������ǰ�Ѿ��������ļ�β���������Ѿ��������ַ���Ϊ����
			//     �����ɹ��򷵻��޷����������͵�token�����򷵻ر�������
			// �����������ַ������֣����洢�������ַ�
			// ��������������ĸ�������Ƿ�Ϊx�Լ�����λ�÷���ʮ����������תΪʮ��������״̬��������������
			// �����������ַ�������������֮һ�������˶������ַ����������Ѿ��������ַ���Ϊ����
			//     �����ɹ��򷵻��޷����������͵�token�����򷵻ر�������
			if (!current_char.has_value()) {
				if (ss.str()[0] == '0' && ss.str().size() > 1) {
					throw Error("StartWithZeroErr", _ptr.first + 1);
				}
				try {
					int ret = std::stoi(ss.str());
					return Token(TokenType::UNSIGNED_INTEGER, ret, _ptr.first + 1);
				}
				catch (std::invalid_argument) {
					throw Error("InvalidAgumentErr", _ptr.first + 1);
				}
				catch (std::out_of_range) {
					throw Error("IntegerOverflowErr", _ptr.first + 1);
				}
			}
			auto ch = current_char.value();
			if (miniplc0::isdigit(ch)) {
				ss << ch;
			}
			else if (miniplc0::isalpha(ch)) {
				ss << ch;
				if (ss.str().size() == 2 && (ch == 'x' || ch == 'X')) {
					current_state = DFAState::HEXADECIMAL_STATE;
				}
				else {
					throw Error("InvalidInputErr", _ptr.first + 1);
				}
			}
			else {
				unreadLast();
				if (ss.str()[0] == '0' && ss.str().size() > 1) {
					throw Error("StartWithZeroErr", _ptr.first + 1);
				}
				try {
					int ret = std::stoi(ss.str());
					return Token(TokenType::UNSIGNED_INTEGER, ret, _ptr.first + 1);
				}
				catch (std::invalid_argument) {
					throw Error("InvalidAgumentErr", _ptr.first + 1);
				}
				catch (std::out_of_range) {
					throw Error("IntegerOverflowErr", _ptr.first + 1);
				}
			}
			break;
		}
		case DFAState::HEXADECIMAL_STATE: {
			if (!current_char.has_value()) {
				try {
					int ret = htoi(ss.str());
					return Token(TokenType::UNSIGNED_INTEGER, ret, _ptr.first + 1);
				}
				catch (std::invalid_argument) {
					throw Error("InvalidAgumentErr", _ptr.first + 1);
				}
				catch (std::out_of_range) {
					throw Error("IntegerOverflowErr", _ptr.first + 1);
				}
			}
			auto ch = current_char.value();
			if (miniplc0::ishexadecimal(ch)) {
				ss << ch;
			}
			else {
				unreadLast();
				try {
					int ret = htoi(ss.str());
					return Token(TokenType::UNSIGNED_INTEGER, ret, _ptr.first + 1);
				}
				catch (std::invalid_argument) {
					throw Error("InvalidAgumentErr", _ptr.first + 1);
				}
				catch (std::out_of_range) {
					throw Error("IntegerOverflowErr", _ptr.first + 1);
				}
			}
			break;
		}
		case DFAState::IDENTIFIER_STATE: {
			// ������ǰ�Ѿ��������ļ�β���������Ѿ��������ַ���
			//     �������������ǹؼ��֣���ô���ض�Ӧ�ؼ��ֵ�token�����򷵻ر�ʶ����token
			// �������������ַ�����ĸ�����洢�������ַ�
			// �����������ַ�������������֮һ�������˶������ַ����������Ѿ��������ַ���
			//     �������������ǹؼ��֣���ô���ض�Ӧ�ؼ��ֵ�token�����򷵻ر�ʶ����token

			if (!current_char.has_value()) {
				std::string str = ss.str();
				if (ReservedWords.find(str) != ReservedWords.end()) {
					return Token(TokenType::RESERVED_WORD, str, _ptr.first + 1);
				}
				else {
					return Token(TokenType::IDENTIFIER, str, _ptr.first + 1);
				}
			}
			auto ch = current_char.value();
			if (miniplc0::isalpha(ch) || miniplc0::isdigit(ch)) {
				ss << ch;
			}
			else {
				unreadLast();
				std::string str = ss.str();
				if (ReservedWords.find(str) != ReservedWords.end()) {
					return Token(TokenType::RESERVED_WORD, str, _ptr.first + 1);
				}
				else {
					return Token(TokenType::IDENTIFIER, str, _ptr.first + 1);
				}
			}
			break;
		}
		case DFAState::PLUS_SIGN_STATE: {
			unreadLast(); // Yes, we unread last char even if it's an EOF.
			return Token(TokenType::PLUS_SIGN, '+', _ptr.first + 1);
		}
		case DFAState::MINUS_SIGN_STATE: {
			unreadLast();
			return Token(TokenType::MINUS_SIGN, '-', _ptr.first + 1);
		}
		case DFAState::MULTIPLICATION_SIGN_STATE: {
			unreadLast();
			return Token(TokenType::MULTIPLICATION_SIGN, '*', _ptr.first + 1);
		}
		case DFAState::DIVISION_SIGN_STATE: {
			unreadLast();
			return Token(TokenType::DIVISION_SIGN, '/', _ptr.first + 1);
		}
		case DFAState::SEMICOLON_STATE: {
			unreadLast();
			return Token(TokenType::SEMICOLON, ';', _ptr.first + 1);
		}
		case DFAState::LEFTBRACKET_STATE: {
			unreadLast();
			return Token(TokenType::LEFT_BRACKET, '(', _ptr.first + 1);
		}
		case DFAState::RIGHTBRACKET_STATE: {
			unreadLast();
			return Token(TokenType::RIGHT_BRACKET, ')', _ptr.first + 1);
		}

										 //c0�ķ�
		case DFAState::COMMA_STATE: {
			unreadLast();
			return Token(TokenType::COMMA_SIGH, ',', _ptr.first + 1);
		}
		case DFAState::LEFTBRACE_STATE: {
			unreadLast();
			return Token(TokenType::LEFT_BRACE, '{', _ptr.first + 1);
		}
		case DFAState::RIGHTBRACE_STATE: {
			unreadLast();
			return Token(TokenType::RIGHT_BRACE, '}', _ptr.first + 1);
		}
		case DFAState::EQUAL_SIGN_STATE: {
			//= & ==
			auto ch = current_char.value();
			if (ch == '=') {
				return Token(TokenType::EQUAL_SIGN, std::string("=="), _ptr.first + 1);
			}
			else {
				unreadLast();
				return Token(TokenType::ASSIGNMENT_SIGN, '=', _ptr.first + 1);
			}
		}
		case DFAState::GREATER_THAN_STATE: {
			//> & >=
			auto ch = current_char.value();
			if (ch == '=') {
				return Token(TokenType::GREATER_THAN_EQUAL_SIGH, std::string(">="), _ptr.first + 1);
			}
			else {
				unreadLast();
				return Token(TokenType::GREATER_THAN_SIGH, '{', _ptr.first + 1);
			}
		}
		case DFAState::LESS_THAN_STATE: {
			//< & <=
			auto ch = current_char.value();
			if (ch == '=') {
				return Token(TokenType::LESS_THAN_EQUAL_SIGH, std::string("<="), _ptr.first + 1);
			}
			else {
				unreadLast();
				return Token(TokenType::LESS_THAN_SIGH, '<', _ptr.first + 1);
			}
		}
		case DFAState::EXCLAMATION_SIGH_STATE: {
			//!=
			auto ch = current_char.value();
			if (ch == '=') {
				return Token(TokenType::UNEQUAL_SIGN, std::string("!="), _ptr.first + 1);
			}
			else {
				throw Error("InvalidInputErr", _ptr.first + 1);
			}
		}
		default:
			break;
		}
	}
}